

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.h
# Opt level: O2

void __thiscall booster::backtrace::backtrace(backtrace *this,size_t frames_no)

{
  int iVar1;
  vector<void_*,_std::allocator<void_*>_> *this_00;
  value_type local_18;
  
  this->_vptr_backtrace = (_func_int **)&PTR__backtrace_00108d30;
  (this->frames_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (frames_no != 0) {
    this_00 = &this->frames_;
    local_18 = (value_type)0x0;
    std::vector<void_*,_std::allocator<void_*>_>::resize(this_00,frames_no,&local_18);
    iVar1 = booster::stack_trace::trace
                      ((this_00->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                       super__Vector_impl_data._M_start,(int)frames_no);
    std::vector<void_*,_std::allocator<void_*>_>::resize(this_00,(long)iVar1);
  }
  return;
}

Assistant:

backtrace(size_t frames_no = default_stack_size) 
        {
            if(frames_no == 0)
                return;
            frames_.resize(frames_no,0);
            int size = stack_trace::trace(&frames_.front(),frames_no);
            frames_.resize(size);
        }